

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O1

bool __thiscall
QStyleSheetStyle::styleSheetPalette
          (QStyleSheetStyle *this,QWidget *w,QStyleOption *opt,QPalette *pal)

{
  QStyleSheetStyle *pQVar1;
  QWidget *w_00;
  quint64 qVar2;
  quint64 qVar3;
  long in_FS_OFFSET;
  bool bVar4;
  QRenderRule rule;
  QRenderRule local_c0;
  long local_38;
  
  pQVar1 = globalStyleSheetStyle;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((pal == (QPalette *)0x0 || (opt == (QStyleOption *)0x0 || w == (QWidget *)0x0)) ||
     (globalStyleSheetStyle != (QStyleSheetStyle *)0x0 &&
      globalStyleSheetStyle != (QStyleSheetStyle *)this)) {
    bVar4 = false;
  }
  else {
    if (globalStyleSheetStyle == (QStyleSheetStyle *)0x0) {
      globalStyleSheetStyle = (QStyleSheetStyle *)this;
    }
    w_00 = containerWidget(w);
    memset(&local_c0,0xaa,0x88);
    qVar2 = pseudoClass((State)(opt->state).super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                               super_QFlagsStorage<QStyle::StateFlag>.i);
    qVar3 = extendedPseudoClass(w_00);
    renderRule(&local_c0,this,&w_00->super_QObject,0,qVar2 | qVar3);
    bVar4 = local_c0.pal.d.ptr != (QStyleSheetPaletteData *)0x0;
    if (bVar4) {
      QRenderRule::configurePalette(&local_c0,pal,NoRole,NoRole);
    }
    QPainterPath::~QPainterPath(&local_c0.clipPath);
    QSharedDataPointer<QStyleSheetImageData>::~QSharedDataPointer(&local_c0.iconPtr);
    QSharedDataPointer<QStyleSheetImageData>::~QSharedDataPointer(&local_c0.img);
    if (local_c0.p.d.ptr != (QStyleSheetPositionData *)0x0) {
      LOCK();
      *(int *)local_c0.p.d.ptr = *(int *)local_c0.p.d.ptr + -1;
      UNLOCK();
      if ((*(int *)local_c0.p.d.ptr == 0) && (local_c0.p.d.ptr != (QStyleSheetPositionData *)0x0)) {
        operator_delete((void *)local_c0.p.d.ptr,0x24);
      }
    }
    if (local_c0.geo.d.ptr != (QStyleSheetGeometryData *)0x0) {
      LOCK();
      *(int *)local_c0.geo.d.ptr = *(int *)local_c0.geo.d.ptr + -1;
      UNLOCK();
      if ((*(int *)local_c0.geo.d.ptr == 0) &&
         (local_c0.geo.d.ptr != (QStyleSheetGeometryData *)0x0)) {
        operator_delete((void *)local_c0.geo.d.ptr,0x1c);
      }
    }
    QSharedDataPointer<QStyleSheetOutlineData>::~QSharedDataPointer(&local_c0.ou);
    QSharedDataPointer<QStyleSheetBorderData>::~QSharedDataPointer(&local_c0.bd);
    QSharedDataPointer<QStyleSheetBackgroundData>::~QSharedDataPointer(&local_c0.bg);
    if (local_c0.b.d.ptr != (QStyleSheetBoxData *)0x0) {
      LOCK();
      *(int *)local_c0.b.d.ptr = *(int *)local_c0.b.d.ptr + -1;
      UNLOCK();
      if ((*(int *)local_c0.b.d.ptr == 0) && (local_c0.b.d.ptr != (QStyleSheetBoxData *)0x0)) {
        operator_delete((void *)local_c0.b.d.ptr,0x28);
      }
    }
    QSharedDataPointer<QStyleSheetPaletteData>::~QSharedDataPointer(&local_c0.pal);
    QHash<QString,_QVariant>::~QHash(&local_c0.styleHints);
    QFont::~QFont(&local_c0.font);
    QBrush::~QBrush(&local_c0.defaultBackground);
    if (pQVar1 == (QStyleSheetStyle *)0x0) {
      globalStyleSheetStyle = (QStyleSheetStyle *)0x0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QStyleSheetStyle::styleSheetPalette(const QWidget* w, const QStyleOption* opt, QPalette* pal)
{
    if (!w || !opt || !pal)
        return false;

    RECURSION_GUARD(return false)

    w = containerWidget(w);

    QRenderRule rule = renderRule(w, PseudoElement_None, pseudoClass(opt->state) | extendedPseudoClass(w));
    if (!rule.hasPalette())
        return false;

    rule.configurePalette(pal, QPalette::NoRole, QPalette::NoRole);
    return true;
}